

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo-history.cpp
# Opt level: O1

void __thiscall rtosc::UndoHistory::recordEvent(UndoHistory *this,char *msg)

{
  long *plVar1;
  UndoHistoryImpl *pUVar2;
  _Map_pointer pppVar3;
  _Map_pointer pppVar4;
  bool bVar5;
  size_t N;
  char *buf;
  time_t now;
  ulong uVar6;
  pair<long,_const_char_*> *ppVar7;
  ulong uVar8;
  pair<long,_const_char_*> local_38;
  
  pUVar2 = this->impl;
  pppVar3 = (pUVar2->history).
            super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  if (((long)(pUVar2->history).
             super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last -
       (long)(pUVar2->history).
             super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
      ((long)(pUVar2->history).
             super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur -
       (long)(pUVar2->history).
             super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
      ((((ulong)((long)pppVar3 -
                (long)(pUVar2->history).
                      super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
      (ulong)(pppVar3 == (_Map_pointer)0x0)) * 0x20 != (pUVar2->history_pos & 0xffffffffU)) {
    std::deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>::
    resize(&pUVar2->history,pUVar2->history_pos);
  }
  N = rtosc_message_length(msg,0xffffffffffffffff);
  buf = (char *)operator_new__(N);
  now = time((time_t *)0x0);
  bVar5 = UndoHistoryImpl::mergeEvent(this->impl,now,msg,buf,N);
  if (!bVar5) {
    memcpy(buf,msg,N);
    local_38.first = now;
    local_38.second = buf;
    std::deque<std::pair<long,char_const*>,std::allocator<std::pair<long,char_const*>>>::
    emplace_back<std::pair<long,char_const*>>
              ((deque<std::pair<long,char_const*>,std::allocator<std::pair<long,char_const*>>> *)
               this->impl,&local_38);
    pUVar2 = this->impl;
    pUVar2->history_pos = pUVar2->history_pos + 1;
    pppVar3 = (pUVar2->history).
              super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    pppVar4 = (pUVar2->history).
              super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    ppVar7 = (pUVar2->history).
             super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((ulong)pUVar2->max_history_size <
        ((long)(pUVar2->history).
               super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last - (long)ppVar7 >> 4) +
        ((long)(pUVar2->history).
               super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur -
         (long)(pUVar2->history).
               super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
        ((((ulong)((long)pppVar3 - (long)pppVar4) >> 3) - 1) + (ulong)(pppVar3 == (_Map_pointer)0x0)
        ) * 0x20) {
      uVar8 = (long)ppVar7 -
              (long)(pUVar2->history).
                    super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first >> 4;
      if (0x1f < uVar8) {
        uVar6 = uVar8 >> 5 | 0xf800000000000000;
        if (0 < (long)uVar8) {
          uVar6 = uVar8 >> 5;
        }
        ppVar7 = pppVar4[uVar6] + uVar8 + uVar6 * -0x20;
      }
      if (ppVar7->second != (char *)0x0) {
        operator_delete__(ppVar7->second);
      }
      std::deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>::
      pop_front(&this->impl->history);
      plVar1 = &this->impl->history_pos;
      *plVar1 = *plVar1 + -1;
    }
  }
  return;
}

Assistant:

void UndoHistory::recordEvent(const char *msg)
{
    //TODO Properly account for when you have traveled back in time.
    //while this could result in another branch of history, the simple method
    //would be to kill off any future redos when new history is recorded
    if(impl->history.size() != (unsigned) impl->history_pos) {
        impl->history.resize(impl->history_pos);
    }

    size_t len = rtosc_message_length(msg, -1);
    char *data = new char[len];
    time_t now = time(NULL);
    //printf("now = '%ld'\n", now);
    if(!impl->mergeEvent(now, msg, data, len)) {
        memcpy(data, msg, len);
        impl->history.push_back(make_pair(now, data));
        impl->history_pos++;
        if(impl->history.size() > impl->max_history_size)
        {
            delete[] impl->history[0].second;
            impl->history.pop_front();
            impl->history_pos--;
        }
    }

}